

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3Module.cpp
# Opt level: O3

void __thiscall w3Module::read_memory(w3Module *this,uint8_t **cursor)

{
  uint32_t uVar1;
  ulong uVar2;
  byte bVar3;
  ulong uVar4;
  w3Limits wVar5;
  string local_40;
  
  puts("reading section5");
  uVar1 = ::read_varuint32(cursor,this->end);
  uVar4 = (ulong)uVar1;
  if (uVar1 < 2) {
    if (uVar4 == 0) {
      uVar2 = (ulong)(this->memory_limits).min;
      uVar4 = (ulong)(this->memory_limits).max;
      bVar3 = (this->memory_limits).hasMax;
      goto LAB_001101a1;
    }
  }
  else {
    StringFormat_abi_cxx11_(&local_40,"%lX",uVar4);
    AssertFailedFormat("size <= 1",&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  do {
    wVar5 = read_limits(this,cursor);
    bVar3 = wVar5.hasMax;
    uVar2 = wVar5._0_8_;
    (this->memory_limits).min = (int)uVar2;
    (this->memory_limits).max = (int)(uVar2 >> 0x20);
    (this->memory_limits).hasMax = (bool)bVar3;
    uVar4 = uVar4 - 1;
  } while (uVar4 != 0);
  uVar4 = uVar2 >> 0x20;
LAB_001101a1:
  printf("read section5 min:%X hasMax:%X max:%X\n",uVar2 & 0xffffffff,(ulong)bVar3,uVar4);
  return;
}

Assistant:

void w3Module::read_memory (uint8_t** cursor)
{
    printf ("reading section5\n");
    const size_t size = read_varuint32 (cursor);
    AssertFormat (size <= 1, ("%" FORMAT_SIZE "X", size)); // FUTURE
    for (size_t i = 0; i < size; ++i)
        memory_limits = read_limits (cursor);
    printf ("read section5 min:%X hasMax:%X max:%X\n", memory_limits.min, memory_limits.hasMax, memory_limits.max);
}